

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_form_suite.cpp
# Opt level: O2

void __thiscall reader_query_form_suite::test_no_value_two::test_method(test_no_value_two *this)

{
  view_type *pvVar1;
  bool bVar2;
  uint local_34c;
  view_type local_348;
  undefined8 *local_338;
  char *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  query_form reader;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char input [14];
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_348.ptr_ = input;
  builtin_strncpy(input + 8,"ravo=",6);
  builtin_strncpy(input,"alpha=&b",8);
  local_348.len_ = strlen(local_348.ptr_);
  trial::url::reader::basic_query_form<char>::basic_query_form(&reader,&local_348);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x90);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_58 = "";
  local_328._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_34c = 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_348,&local_60,0x90,2,2,&local_328,"reader.subcode()",&local_34c,
             "url::token::subcode::query_form_key");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x91);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[6]>
            (&local_348,&local_90,0x91,2,2,
             &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view,
             "reader.literal()","alpha","\"alpha\"");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x92);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_288 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_328._M_dataplus._M_p._0_4_ = CONCAT31(local_328._M_dataplus._M_p._1_3_,bVar2);
  local_34c = CONCAT31(local_34c._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_290,0x92,2,2,&local_328,"reader.next()",&local_34c,"true");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x93);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_d8 = "";
  local_328._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_34c = 0xb;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_348,&local_e0,0x93,2,2,&local_328,"reader.subcode()",&local_34c,
             "url::token::subcode::query_form_value");
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x94);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_108 = "";
  pvVar1 = &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[1]>
            (&local_348,&local_110,0x94,2,2,pvVar1,"reader.literal()","","\"\"");
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x95);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_298 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_328,pvVar1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_348,&local_2a0,0x95,2,2,&local_328,"reader.value<std::string>()","","\"\"");
  std::__cxx11::string::~string((string *)&local_328);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x96);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_2a8 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_328._M_dataplus._M_p._0_4_ = CONCAT31(local_328._M_dataplus._M_p._1_3_,bVar2);
  local_34c = CONCAT31(local_34c._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_2b0,0x96,2,2,&local_328,"reader.next()",&local_34c,"true");
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x97);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_178 = "";
  local_328._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_34c = 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_348,&local_180,0x97,2,2,&local_328,"reader.subcode()",&local_34c,
             "url::token::subcode::query_form_key");
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x98);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1a8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[6]>
            (&local_348,&local_1b0,0x98,2,2,
             &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view,
             "reader.literal()","bravo","\"bravo\"");
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x99);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_2b8 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_328._M_dataplus._M_p._0_4_ = CONCAT31(local_328._M_dataplus._M_p._1_3_,bVar2);
  local_34c = CONCAT31(local_34c._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_2c0,0x99,2,2,&local_328,"reader.next()",&local_34c,"true");
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x9a);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1f8 = "";
  local_328._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_34c = 0xb;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_348,&local_200,0x9a,2,2,&local_328,"reader.subcode()",&local_34c,
             "url::token::subcode::query_form_value");
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x9b);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_228 = "";
  pvVar1 = &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[1]>
            (&local_348,&local_230,0x9b,2,2,pvVar1,"reader.literal()","","\"\"");
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x9c);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_2c8 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_328,pvVar1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_348,&local_2d0,0x9c,2,2,&local_328,"reader.value<std::string>()","","\"\"");
  std::__cxx11::string::~string((string *)&local_328);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_258 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x9d);
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = "";
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_2d8 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_328._M_dataplus._M_p._0_4_ = CONCAT31(local_328._M_dataplus._M_p._1_3_,bVar2);
  local_34c = local_34c & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_2e0,0x9d,2,2,&local_328,"reader.next()",&local_34c,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_no_value_two)
{
    const char input[] = "alpha=&bravo=";
    url::reader::query_form reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "bravo");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}